

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::CreateClassInstance(SQVM *this,SQClass *theclass,SQObjectPtr *inst,SQObjectPtr *constructor)

{
  bool bVar1;
  SQInstance *x;
  SQObjectPtr *constructor_local;
  SQObjectPtr *inst_local;
  SQClass *theclass_local;
  SQVM *this_local;
  
  x = SQClass::CreateInstance(theclass);
  ::SQObjectPtr::operator=(inst,x);
  bVar1 = SQClass::GetConstructor(theclass,constructor);
  if (!bVar1) {
    ::SQObjectPtr::Null(constructor);
  }
  return true;
}

Assistant:

bool SQVM::CreateClassInstance(SQClass *theclass, SQObjectPtr &inst, SQObjectPtr &constructor)
{
    inst = theclass->CreateInstance();
    if(!theclass->GetConstructor(constructor)) {
        constructor.Null();
    }
    return true;
}